

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O3

void Cmd_playersounds(FCommandLine *argv,APlayerPawn *who,int key)

{
  Entry *pEVar1;
  long lVar2;
  uint *puVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  char *reserveNames [256];
  undefined8 local_838 [257];
  
  iVar4 = 0;
  memset(local_838,0,0x800);
  if (S_sfx.Count != 0 && 0 < NumPlayerReserves) {
    puVar3 = &(S_sfx.Array)->link;
    uVar7 = 1;
    do {
      if ((puVar3[-2] & 2) != 0) {
        iVar4 = iVar4 + 1;
        local_838[*puVar3] = ((FString *)(puVar3 + -10))->Chars;
      }
      if (NumPlayerReserves <= iVar4) break;
      puVar3 = puVar3 + 0x14;
      bVar9 = uVar7 < S_sfx.Count;
      uVar7 = uVar7 + 1;
    } while (bVar9);
  }
  if (PlayerClassLookups.Count != 0) {
    uVar7 = 0;
    do {
      lVar8 = 0;
      do {
        uVar5 = (ulong)PlayerClassLookups.Array[uVar7].ListIndex[lVar8];
        if (uVar5 != 0xffff) {
          Printf("\n%s, %s:\n",PlayerClassLookups.Array[uVar7].Name.Chars,GenderNames[lVar8]);
          if (0 < NumPlayerReserves) {
            uVar6 = 0;
            do {
              pEVar1 = (Entry *)(PlayerSounds.Array[uVar5].Buckets +
                                (uint)((int)((uVar6 & 0xffffffff) / 0x17) +
                                       (int)((uVar6 & 0xffffffff) / 0x17) * -0x18 + (int)uVar6));
              do {
                pEVar1 = pEVar1->Next;
                if (pEVar1 == (Entry *)0x0) {
                  lVar2 = 0;
                  goto LAB_002f6f63;
                }
              } while (uVar6 != (uint)pEVar1->PlayerSoundID);
              lVar2 = (long)pEVar1->SfxID;
LAB_002f6f63:
              Printf(" %-16s%s\n",local_838[uVar6],S_sfx.Array[lVar2].name.Chars);
              uVar6 = uVar6 + 1;
            } while ((long)uVar6 < (long)NumPlayerReserves);
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      uVar7 = uVar7 + 1;
    } while (uVar7 < PlayerClassLookups.Count);
  }
  return;
}

Assistant:

CCMD (playersounds)
{
	const char *reserveNames[256];
	unsigned int i;
	int j, k, l;

	// Find names for the player sounds
	memset (reserveNames, 0, sizeof(reserveNames));
	for (i = j = 0; j < NumPlayerReserves && i < S_sfx.Size(); ++i)
	{
		if (S_sfx[i].bPlayerReserve)
		{
			++j;
			reserveNames[S_sfx[i].link] = S_sfx[i].name;
		}
	}

	for (i = 0; i < PlayerClassLookups.Size(); ++i)
	{
		for (j = 0; j < 3; ++j)
		{
			if ((l = PlayerClassLookups[i].ListIndex[j]) != 0xffff)
			{
				Printf ("\n%s, %s:\n", PlayerClassLookups[i].Name.GetChars(), GenderNames[j]);
				for (k = 0; k < NumPlayerReserves; ++k)
				{
					Printf (" %-16s%s\n", reserveNames[k], S_sfx[PlayerSounds[l].LookupSound (k)].name.GetChars());
				}
			}
		}
	}
}